

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  int iVar1;
  uint64_t uVar2;
  secp256k1_fe s;
  secp256k1_fe local_158;
  undefined1 local_128 [16];
  uint64_t local_118;
  uint64_t uStack_110;
  secp256k1_fe local_108;
  secp256k1_fe u1;
  secp256k1_fe g;
  secp256k1_fe local_88;
  secp256k1_fe d;
  
  u1.n[0] = u->n[0];
  u1.n[1] = u->n[1];
  u1.n[2] = u->n[2];
  u1.n[3] = u->n[3];
  u1.n[4] = u->n[4];
  iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&u1);
  if (iVar1 != 0) {
    u1.n[2] = 0;
    u1.n[3] = 0;
    u1.n[0] = 1;
    u1.n[1] = 0;
    u1.n[4] = 0;
  }
  secp256k1_fe_impl_sqr(&s,t);
  iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(t);
  if (iVar1 == 0) {
    local_128._8_8_ = s.n[1];
    local_128._0_8_ = s.n[0];
    local_118 = s.n[2];
    uStack_110 = s.n[3];
  }
  else {
    s.n[0] = 1;
    s.n[1] = 0;
    s.n[4] = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128._0_12_ = ZEXT812(1);
    local_128._12_4_ = 0;
  }
  uVar2 = s.n[4];
  s.n[2] = local_118;
  s.n[3] = uStack_110;
  secp256k1_fe_impl_sqr(&local_88,&u1);
  secp256k1_fe_impl_mul(&g,&local_88,&u1);
  g.n[0] = g.n[0] + 7;
  local_158.n[0] = g.n[0] + local_128._0_8_;
  local_158.n[1] = g.n[1] + local_128._8_8_;
  local_158.n[2] = g.n[2] + local_118;
  local_158.n[3] = g.n[3] + uStack_110;
  local_158.n[4] = g.n[4] + uVar2;
  iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_158);
  if (iVar1 != 0) {
    s.n[0] = local_128._0_8_ * 4;
    s.n[1] = local_128._8_8_ * 4;
    s.n[2] = local_118 * 4;
    s.n[3] = uStack_110 * 4;
    local_158.n[0] = g.n[0] + s.n[0];
    local_158.n[1] = g.n[1] + s.n[1];
    local_158.n[2] = g.n[2] + s.n[2];
    s.n[4] = uVar2 * 4;
    local_158.n[3] = g.n[3] + s.n[3];
    local_158.n[4] = g.n[4] + s.n[4];
  }
  secp256k1_fe_impl_mul(&d,&s,&local_88);
  d.n[0] = d.n[0] * 3;
  d.n[1] = d.n[1] * 3;
  d.n[2] = d.n[2] * 3;
  d.n[3] = d.n[3] * 3;
  d.n[4] = d.n[4] * 3;
  secp256k1_fe_impl_sqr(&local_88,&local_158);
  uVar2 = 0x3fffffffffffc - local_88.n[4];
  local_88.n[4] = uVar2;
  secp256k1_fe_impl_mul(&local_108,&d,&u1);
  local_88.n[0] = 0x3ffffbfffff0bc - local_88.n[0];
  local_88.n[1] = 0x3ffffffffffffc - local_88.n[1];
  local_108.n[0] = local_88.n[0] + local_108.n[0];
  local_108.n[1] = local_88.n[1] + local_108.n[1];
  local_88.n[2] = 0x3ffffffffffffc - local_88.n[2];
  local_88.n[3] = 0x3ffffffffffffc - local_88.n[3];
  local_108.n[2] = local_88.n[2] + local_108.n[2];
  local_108.n[3] = local_88.n[3] + local_108.n[3];
  local_108.n[4] = local_108.n[4] + uVar2;
  iVar1 = secp256k1_ge_x_frac_on_curve_var(&local_108,&d);
  if (iVar1 == 0) {
    xd->n[4] = local_158.n[4];
    xd->n[2] = local_158.n[2];
    xd->n[3] = local_158.n[3];
    xd->n[0] = local_158.n[0];
    xd->n[1] = local_158.n[1];
    secp256k1_fe_impl_mul(&local_88,&secp256k1_ellswift_c1,&s);
    secp256k1_fe_impl_mul(&local_108,&secp256k1_ellswift_c2,&g);
    local_108.n[0] = local_108.n[0] + local_88.n[0];
    local_108.n[1] = local_108.n[1] + local_88.n[1];
    local_108.n[2] = local_108.n[2] + local_88.n[2];
    local_108.n[3] = local_108.n[3] + local_88.n[3];
    local_108.n[4] = local_108.n[4] + local_88.n[4];
    secp256k1_fe_impl_mul(&local_108,&local_108,&u1);
    iVar1 = secp256k1_ge_x_frac_on_curve_var(&local_108,&local_158);
    if (iVar1 == 0) {
      secp256k1_fe_impl_mul(&local_88,&local_158,&u1);
      local_108.n[0] = local_108.n[0] + local_88.n[0];
      local_108.n[1] = local_108.n[1] + local_88.n[1];
      local_108.n[2] = local_108.n[2] + local_88.n[2];
      local_108.n[3] = local_108.n[3] + local_88.n[3];
      local_108.n[4] = local_108.n[4] + local_88.n[4];
      secp256k1_fe_impl_negate_unchecked(xn,&local_108,2);
    }
    else {
      xn->n[4] = local_108.n[4];
      xn->n[2] = local_108.n[2];
      xn->n[3] = local_108.n[3];
      xn->n[0] = local_108.n[0];
      xn->n[1] = local_108.n[1];
    }
  }
  else {
    xn->n[4] = local_108.n[4];
    xn->n[2] = local_108.n[2];
    xn->n[3] = local_108.n[3];
    xn->n[0] = local_108.n[0];
    xn->n[1] = local_108.n[1];
    xd->n[4] = d.n[4];
    xd->n[2] = d.n[2];
    xd->n[3] = d.n[3];
    xd->n[0] = d.n[0];
    xd->n[1] = d.n[1];
  }
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}